

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall
TCLAP::StdOutput::spacePrint
          (StdOutput *this,ostream *os,string *s,int maxWidth,int indentSpaces,int secondLineOffset)

{
  string *psVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  bool bVar5;
  int local_78;
  int i_2;
  string local_68 [32];
  int local_48;
  int local_44;
  int i_1;
  int i;
  int local_38;
  int stringLen;
  int start;
  int allowedLen;
  int len;
  int secondLineOffset_local;
  int indentSpaces_local;
  int maxWidth_local;
  string *s_local;
  ostream *os_local;
  StdOutput *this_local;
  
  allowedLen = secondLineOffset;
  len = indentSpaces;
  secondLineOffset_local = maxWidth;
  _indentSpaces_local = s;
  s_local = (string *)os;
  os_local = (ostream *)this;
  start = std::__cxx11::string::length();
  if ((secondLineOffset_local < start + len) && (0 < secondLineOffset_local)) {
    stringLen = secondLineOffset_local - len;
    for (local_38 = 0; local_38 < start; local_38 = i + local_38) {
      i_1 = start - local_38;
      piVar2 = std::min<int>(&i_1,&stringLen);
      i = *piVar2;
      if (i == stringLen) {
        while( true ) {
          bVar5 = false;
          if (-1 < i) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)_indentSpaces_local);
            bVar5 = false;
            if (*pcVar3 != ' ') {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)_indentSpaces_local);
              bVar5 = false;
              if (*pcVar3 != ',') {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)_indentSpaces_local);
                bVar5 = *pcVar3 != '|';
              }
            }
          }
          if (!bVar5) break;
          i = i + -1;
        }
      }
      if (i < 1) {
        i = stringLen;
      }
      for (local_44 = 0; local_44 < i; local_44 = local_44 + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)_indentSpaces_local);
        if (*pcVar3 == '\n') {
          i = local_44 + 1;
        }
      }
      for (local_48 = 0; psVar1 = s_local, local_48 < len; local_48 = local_48 + 1) {
        std::operator<<((ostream *)s_local," ");
      }
      if (local_38 == 0) {
        len = allowedLen + len;
        stringLen = stringLen - allowedLen;
      }
      std::__cxx11::string::substr((ulong)local_68,(ulong)_indentSpaces_local);
      poVar4 = std::operator<<((ostream *)psVar1,local_68);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_68);
      while (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)_indentSpaces_local),
            *pcVar3 == ' ' && local_38 < start) {
        local_38 = local_38 + 1;
      }
    }
  }
  else {
    for (local_78 = 0; local_78 < len; local_78 = local_78 + 1) {
      std::operator<<((ostream *)s_local," ");
    }
    poVar4 = std::operator<<((ostream *)s_local,(string *)_indentSpaces_local);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void StdOutput::spacePrint( std::ostream& os, 
						           const std::string& s, 
						           int maxWidth, 
						           int indentSpaces, 
						           int secondLineOffset ) const
{
	int len = static_cast<int>(s.length());

	if ( (len + indentSpaces > maxWidth) && maxWidth > 0 )
		{
			int allowedLen = maxWidth - indentSpaces;
			int start = 0;
			while ( start < len )
				{
					// find the substring length
					// int stringLen = std::min<int>( len - start, allowedLen );
					// doing it this way to support a VisualC++ 2005 bug 
					using namespace std; 
					int stringLen = min<int>( len - start, allowedLen );

					// trim the length so it doesn't end in middle of a word
					if ( stringLen == allowedLen )
						while ( stringLen >= 0 &&
								s[stringLen+start] != ' ' && 
								s[stringLen+start] != ',' &&
								s[stringLen+start] != '|' ) 
							stringLen--;
	
					// ok, the word is longer than the line, so just split 
					// wherever the line ends
					if ( stringLen <= 0 )
						stringLen = allowedLen;

					// check for newlines
					for ( int i = 0; i < stringLen; i++ )
						if ( s[start+i] == '\n' )
							stringLen = i+1;

					// print the indent	
					for ( int i = 0; i < indentSpaces; i++ )
						os << " ";

					if ( start == 0 )
						{
							// handle second line offsets
							indentSpaces += secondLineOffset;

							// adjust allowed len
							allowedLen -= secondLineOffset;
						}

					os << s.substr(start,stringLen) << std::endl;

					// so we don't start a line with a space
					while ( s[stringLen+start] == ' ' && start < len )
						start++;
			
					start += stringLen;
				}
		}
	else
		{
			for ( int i = 0; i < indentSpaces; i++ )
				os << " ";
			os << s << std::endl;
		}
}